

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

void FT_Vector_Transform(FT_Vector *vector,FT_Matrix *matrix)

{
  FT_Long FVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  
  if (matrix != (FT_Matrix *)0x0 && vector != (FT_Vector *)0x0) {
    FVar3 = vector->x;
    FVar1 = FT_MulFix(FVar3,matrix->xx);
    FVar4 = vector->y;
    FVar2 = FT_MulFix(FVar4,matrix->xy);
    FVar3 = FT_MulFix(FVar3,matrix->yx);
    FVar4 = FT_MulFix(FVar4,matrix->yy);
    vector->x = FVar2 + FVar1;
    vector->y = FVar4 + FVar3;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Transform( FT_Vector*        vector,
                       const FT_Matrix*  matrix )
  {
    FT_Pos  xz, yz;


    if ( !vector || !matrix )
      return;

    xz = FT_MulFix( vector->x, matrix->xx ) +
         FT_MulFix( vector->y, matrix->xy );

    yz = FT_MulFix( vector->x, matrix->yx ) +
         FT_MulFix( vector->y, matrix->yy );

    vector->x = xz;
    vector->y = yz;
  }